

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManOperation(If_DsdMan_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int c;
  If_DsdObj_t *pObj_00;
  bool bVar5;
  int local_148;
  int iLitNew;
  int pFirsts [12];
  int local_108;
  int uCanonPhase;
  int i_1;
  char pCanonPerm [12];
  int t;
  int nSupp2;
  int nSupp1;
  int nSupp0;
  int RetValue;
  int nSSize;
  int fCompl;
  int iFanin;
  int Id;
  int j;
  int k;
  int i;
  int pBegEnd [12];
  int pChildren [12];
  uchar *puStack_60;
  int nChildren;
  uchar *pPermStart;
  uchar pPermNew [12];
  If_DsdObj_t *pFanin;
  If_DsdObj_t *pObj;
  word *pTruth_local;
  uchar *pPerm_local;
  int nLits_local;
  int *pLits_local;
  int Type_local;
  If_DsdMan_t *p_local;
  
  pChildren[0xb] = 0;
  RetValue = 0;
  nSupp0 = 0;
  puStack_60 = pPerm;
  if ((Type == 3) || (Type == 4)) {
    for (Id = 0; Id < nLits; Id = Id + 1) {
      if ((Type == 4) && (iVar1 = Abc_LitIsCompl(pLits[Id]), iVar1 != 0)) {
        iVar1 = Abc_LitNot(pLits[Id]);
        pLits[Id] = iVar1;
        RetValue = RetValue ^ 1;
      }
      iVar1 = Abc_Lit2Var(pLits[Id]);
      pObj_00 = If_DsdVecObj(&p->vObjs,iVar1);
      iVar1 = If_DsdObjType(pObj_00);
      if ((Type == iVar1) && ((Type == 4 || (iVar1 = Abc_LitIsCompl(pLits[Id]), iVar1 == 0)))) {
        j = 0;
        while( true ) {
          iVar1 = If_DsdObjFaninNum(pObj_00);
          bVar5 = false;
          if (j < iVar1) {
            nSSize = If_DsdObjFaninLit(pObj_00,j);
            bVar5 = nSSize != 0;
          }
          if (!bVar5) break;
          if ((Type != 3) && (iVar1 = Abc_LitIsCompl(nSSize), iVar1 != 0)) {
            __assert_fail("Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                          ,0x60c,
                          "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                         );
          }
          pBegEnd[(long)pChildren[0xb] + 10] = nSSize;
          iVar1 = If_DsdVecLitSuppSize(&p->vObjs,nSSize);
          (&k)[pChildren[0xb]] = nSupp0 << 0x10 | nSupp0 + iVar1;
          iVar1 = If_DsdVecLitSuppSize(&p->vObjs,nSSize);
          nSupp0 = iVar1 + nSupp0;
          j = j + 1;
          pChildren[0xb] = pChildren[0xb] + 1;
        }
      }
      else {
        iVar1 = pLits[Id];
        iVar2 = If_DsdManPushInv(p,pLits[Id],puStack_60);
        iVar1 = Abc_LitNotCond(iVar1,iVar2);
        pBegEnd[(long)pChildren[0xb] + 10] = iVar1;
        iVar1 = If_DsdObjSuppSize(pObj_00);
        (&k)[pChildren[0xb]] = nSupp0 << 0x10 | nSupp0 + iVar1;
        iVar1 = If_DsdObjSuppSize(pObj_00);
        nSupp0 = iVar1 + nSupp0;
        pChildren[0xb] = pChildren[0xb] + 1;
      }
      iVar1 = If_DsdObjSuppSize(pObj_00);
      puStack_60 = puStack_60 + iVar1;
    }
    If_DsdObjSort(p,&p->vObjs,pBegEnd + 10,pChildren[0xb],&k);
    iFanin = 0;
    for (j = 0; j < pChildren[0xb]; j = j + 1) {
      for (Id = (&k)[j] >> 0x10; Id < (int)((&k)[j] & 0xffU); Id = Id + 1) {
        *(uchar *)((long)&pPermStart + (long)iFanin + 4) = pPerm[Id];
        iFanin = iFanin + 1;
      }
    }
    if (iFanin != nSupp0) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x61f,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    for (iFanin = 0; iFanin < nSupp0; iFanin = iFanin + 1) {
      pPerm[iFanin] = *(uchar *)((long)&pPermStart + (long)iFanin + 4);
    }
  }
  else if (Type == 5) {
    if (nLits != 3) {
      __assert_fail("nLits == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x626,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    for (Id = 0; Id < 3; Id = Id + 1) {
      iVar1 = Abc_Lit2Var(pLits[Id]);
      pPermNew._4_8_ = If_DsdVecObj(&p->vObjs,iVar1);
      iVar1 = pLits[Id];
      iVar2 = If_DsdManPushInv(p,pLits[Id],puStack_60);
      iVar1 = Abc_LitNotCond(iVar1,iVar2);
      pLits[Id] = iVar1;
      puStack_60 = puStack_60 + (int)(*(uint *)(pPermNew._4_8_ + 4) >> 3 & 0x1f);
    }
    iVar1 = If_DsdObjCompare(p,&p->vObjs,pLits[1],pLits[2]);
    if ((iVar1 == 1) || ((iVar1 == 0 && (iVar1 = Abc_LitIsCompl(*pLits), iVar1 != 0)))) {
      iVar2 = If_DsdVecLitSuppSize(&p->vObjs,*pLits);
      iVar3 = If_DsdVecLitSuppSize(&p->vObjs,pLits[1]);
      pCanonPerm._8_4_ = If_DsdVecLitSuppSize(&p->vObjs,pLits[2]);
      iVar1 = Abc_LitNot(*pLits);
      *pLits = iVar1;
      iVar1 = pLits[1];
      pCanonPerm[4] = (char)iVar1;
      pCanonPerm[5] = (char)((uint)iVar1 >> 8);
      pCanonPerm[6] = (char)((uint)iVar1 >> 0x10);
      pCanonPerm[7] = (char)((uint)iVar1 >> 0x18);
      pLits[1] = pLits[2];
      pLits[2] = iVar1;
      iFanin = 0;
      for (Id = 0; Id < iVar2; Id = Id + 1) {
        *(uchar *)((long)&pPermStart + (long)iFanin + 4) = pPerm[Id];
        iFanin = iFanin + 1;
      }
      for (Id = 0; Id < (int)pCanonPerm._8_4_; Id = Id + 1) {
        *(uchar *)((long)&pPermStart + (long)iFanin + 4) = pPerm[iVar2 + iVar3 + Id];
        iFanin = iFanin + 1;
      }
      for (Id = 0; Id < iVar3; Id = Id + 1) {
        *(uchar *)((long)&pPermStart + (long)iFanin + 4) = pPerm[iVar2 + Id];
        iFanin = iFanin + 1;
      }
      for (iFanin = 0; iFanin < iVar2 + iVar3 + pCanonPerm._8_4_; iFanin = iFanin + 1) {
        pPerm[iFanin] = *(uchar *)((long)&pPermStart + (long)iFanin + 4);
      }
    }
    iVar1 = Abc_LitIsCompl(pLits[1]);
    if (iVar1 != 0) {
      iVar2 = Abc_LitNot(pLits[1]);
      pLits[1] = iVar2;
      iVar2 = Abc_LitNot(pLits[2]);
      pLits[2] = iVar2;
    }
    RetValue = (int)(iVar1 != 0);
    puStack_60 = pPerm;
    for (Id = 0; Id < 3; Id = Id + 1) {
      iVar1 = Abc_Lit2Var(pLits[Id]);
      pPermNew._4_8_ = If_DsdVecObj(&p->vObjs,iVar1);
      iVar1 = pLits[Id];
      iVar2 = If_DsdManPushInv(p,pLits[Id],puStack_60);
      iVar1 = Abc_LitNotCond(iVar1,iVar2);
      pBegEnd[(long)pChildren[0xb] + 10] = iVar1;
      puStack_60 = puStack_60 + (int)(*(uint *)(pPermNew._4_8_ + 4) >> 3 & 0x1f);
      pChildren[0xb] = pChildren[0xb] + 1;
    }
  }
  else {
    if (Type != 6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x661,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    uVar4 = Abc_TtCanonicize(pTruth,nLits,(char *)&uCanonPhase);
    RetValue = (int)uVar4 >> ((byte)nLits & 0x1f) & 1;
    iVar1 = If_DsdManComputeFirstArray(p,pLits,nLits,&local_148);
    iFanin = 0;
    for (local_108 = 0; local_108 < nLits; local_108 = local_108 + 1) {
      iVar3 = Abc_LitNotCond(pLits[(int)*(char *)((long)&uCanonPhase + (long)local_108)],
                             (int)uVar4 >> ((byte)local_108 & 0x1f) & 1);
      iVar2 = Abc_Lit2Var(iVar3);
      pPermNew._4_8_ = If_DsdVecObj(&p->vObjs,iVar2);
      iVar2 = (&local_148)[(int)*(char *)((long)&uCanonPhase + (long)local_108)];
      c = If_DsdManPushInv(p,iVar3,pPerm + iVar2);
      iVar3 = Abc_LitNotCond(iVar3,c);
      pBegEnd[(long)pChildren[0xb] + 10] = iVar3;
      for (Id = 0; Id < (int)(*(uint *)(pPermNew._4_8_ + 4) >> 3 & 0x1f); Id = Id + 1) {
        *(uchar *)((long)&pPermStart + (long)iFanin + 4) = (pPerm + iVar2)[Id];
        iFanin = iFanin + 1;
      }
      pChildren[0xb] = pChildren[0xb] + 1;
    }
    if (iFanin != iVar1) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x65c,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    for (iFanin = 0; iFanin < iVar1; iFanin = iFanin + 1) {
      pPerm[iFanin] = *(uchar *)((long)&pPermStart + (long)iFanin + 4);
    }
    Abc_TtStretch6(pTruth,nLits,p->nVars);
  }
  iVar1 = If_DsdObjFindOrAdd(p,Type,pBegEnd + 10,pChildren[0xb],pTruth);
  iVar1 = Abc_Var2Lit(iVar1,RetValue);
  return iVar1;
}

Assistant:

int If_DsdManOperation( If_DsdMan_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    If_DsdObj_t * pObj, * pFanin;
    unsigned char pPermNew[DAU_MAX_VAR], * pPermStart = pPerm;
    int nChildren = 0, pChildren[DAU_MAX_VAR], pBegEnd[DAU_MAX_VAR];
    int i, k, j, Id, iFanin, fCompl = 0, nSSize = 0;
    if ( Type == IF_DSD_AND || Type == IF_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            if ( Type == IF_DSD_XOR && Abc_LitIsCompl(pLits[k]) )
            {
                pLits[k] = Abc_LitNot(pLits[k]);
                fCompl ^= 1;
            }
            pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            if ( Type == If_DsdObjType(pObj) && (Type == IF_DSD_XOR || !Abc_LitIsCompl(pLits[k])) )
            {
                If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
                {
                    assert( Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin) );
                    pChildren[nChildren] = iFanin;
                    pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdVecLitSuppSize(&p->vObjs, iFanin));
                    nSSize += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
                }
            }
            else
            {
                pChildren[nChildren] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
                pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdObjSuppSize(pObj));
                nSSize += If_DsdObjSuppSize(pObj);
            }
            pPermStart += If_DsdObjSuppSize(pObj);
        }
        If_DsdObjSort( p, &p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPermNew[j++] = pPerm[k];
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
    }
    else if ( Type == IF_DSD_MUX )
    {
        int RetValue;
        assert( nLits == 3 );
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pLits[k] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
        RetValue = If_DsdObjCompare( p, &p->vObjs, pLits[1], pLits[2] );
        if ( RetValue == 1 || (RetValue == 0 && Abc_LitIsCompl(pLits[0])) )
        {
            int nSupp0 = If_DsdVecLitSuppSize( &p->vObjs, pLits[0] );
            int nSupp1 = If_DsdVecLitSuppSize( &p->vObjs, pLits[1] );
            int nSupp2 = If_DsdVecLitSuppSize( &p->vObjs, pLits[2] );
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
            for ( j = k = 0; k < nSupp0; k++ )
                pPermNew[j++] = pPerm[k];
            for ( k = 0; k < nSupp2; k++ )
                pPermNew[j++] = pPerm[nSupp0 + nSupp1 + k];
            for ( k = 0; k < nSupp1; k++ )
                pPermNew[j++] = pPerm[nSupp0 + k];
            for ( j = 0; j < nSupp0 + nSupp1 + nSupp2; j++ )
                pPerm[j] = pPermNew[j];
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        pPermStart = pPerm;
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pChildren[nChildren++] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
    }
    else if ( Type == IF_DSD_PRIME )
    {
        char pCanonPerm[DAU_MAX_VAR];
        int i, uCanonPhase, pFirsts[DAU_MAX_VAR];
        uCanonPhase = Abc_TtCanonicize( pTruth, nLits, pCanonPerm );
        fCompl = ((uCanonPhase >> nLits) & 1);
        nSSize = If_DsdManComputeFirstArray( p, pLits, nLits, pFirsts );
        for ( j = i = 0; i < nLits; i++ )
        {
            int iLitNew = Abc_LitNotCond( pLits[(int)pCanonPerm[i]], ((uCanonPhase>>i)&1) );
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLitNew) );
            pPermStart = pPerm + pFirsts[(int)pCanonPerm[i]];
            pChildren[nChildren++] = Abc_LitNotCond( iLitNew, If_DsdManPushInv(p, iLitNew, pPermStart) );
            for ( k = 0; k < (int)pFanin->nSupp; k++ )            
                pPermNew[j++] = pPermStart[k];
        }
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
        Abc_TtStretch6( pTruth, nLits, p->nVars );
    }
    else assert( 0 );
    // create new graph
    Id = If_DsdObjFindOrAdd( p, Type, pChildren, nChildren, pTruth );
    return Abc_Var2Lit( Id, fCompl );
}